

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O0

base_learner * memory_tree_setup(options_i *options,vw *all)

{
  size_t sVar1;
  parser *ppVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  vw *pvVar10;
  option_group_definition *l_00;
  pointer pmVar11;
  ulong uVar12;
  ostream *poVar13;
  learner<memory_tree_ns::memory_tree,_example> *plVar14;
  single_learner *base;
  typed_option<float> *this;
  vw *in_RSI;
  undefined8 *in_RDI;
  __type_conflict _Var15;
  __type_conflict _Var16;
  double dVar17;
  undefined1 auVar18 [16];
  learner<memory_tree_ns::memory_tree,_example> *l_1;
  learner<memory_tree_ns::memory_tree,_example> *l;
  size_t num_learners;
  option_group_definition new_options;
  free_ptr<memory_tree_ns::memory_tree> tree;
  undefined4 in_stack_fffffffffffff328;
  prediction_type_t in_stack_fffffffffffff32c;
  vw *in_stack_fffffffffffff330;
  string *in_stack_fffffffffffff338;
  typed_option<float> *in_stack_fffffffffffff340;
  learner<char,_example> *in_stack_fffffffffffff348;
  learner<memory_tree_ns::memory_tree,_example> *in_stack_fffffffffffff350;
  prediction_type_t in_stack_fffffffffffff360;
  typed_option<float> *in_stack_fffffffffffff378;
  memory_tree *in_stack_fffffffffffff380;
  allocator local_9f1;
  string local_9f0 [39];
  allocator local_9c9;
  string local_9c8 [199];
  allocator local_901;
  string local_900 [39];
  allocator local_8d9;
  string local_8d8 [199];
  allocator local_811;
  string local_810 [39];
  allocator local_7e9;
  string local_7e8 [199];
  allocator local_721;
  string local_720 [39];
  allocator local_6f9;
  string local_6f8 [199];
  allocator local_631;
  string local_630 [39];
  allocator local_609;
  string local_608 [199];
  allocator local_541;
  string local_540 [39];
  allocator local_519;
  string local_518 [199];
  allocator local_451;
  string local_450 [39];
  allocator local_429;
  string local_428 [199];
  allocator local_361;
  string local_360 [39];
  allocator local_339;
  string local_338 [199];
  allocator local_271;
  string local_270 [39];
  allocator local_249;
  string local_248 [199];
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [32];
  typed_option<unsigned_long> local_138;
  allocator local_81;
  string local_80 [32];
  undefined1 local_60 [56];
  learner<memory_tree_ns::memory_tree,_example> local_28 [16];
  vw *local_18;
  undefined8 *local_10;
  base_learner *local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  scoped_calloc_or_throw<memory_tree_ns::memory_tree>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"Memory Tree",&local_81);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff330,
             (string *)CONCAT44(in_stack_fffffffffffff32c,in_stack_fffffffffffff328));
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"memory_tree",&local_159);
  std::unique_ptr<memory_tree_ns::memory_tree,_void_(*)(void_*)>::operator->
            ((unique_ptr<memory_tree_ns::memory_tree,_void_(*)(void_*)> *)0x2b67e8);
  VW::config::make_option<unsigned_long>
            (in_stack_fffffffffffff338,(unsigned_long *)in_stack_fffffffffffff330);
  VW::config::typed_option<unsigned_long>::keep(&local_138,true);
  VW::config::typed_option<unsigned_long>::default_value
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff340,
             (unsigned_long)in_stack_fffffffffffff338);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"Make a memory tree with at most <n> nodes",&local_181);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff330,
             (string *)CONCAT44(in_stack_fffffffffffff32c,in_stack_fffffffffffff328));
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            ((option_group_definition *)in_stack_fffffffffffff380,
             (typed_option<unsigned_long> *)in_stack_fffffffffffff378);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_248,"max_number_of_labels",&local_249);
  std::unique_ptr<memory_tree_ns::memory_tree,_void_(*)(void_*)>::operator->
            ((unique_ptr<memory_tree_ns::memory_tree,_void_(*)(void_*)> *)0x2b68ee);
  VW::config::make_option<unsigned_long>
            (in_stack_fffffffffffff338,(unsigned_long *)in_stack_fffffffffffff330);
  VW::config::typed_option<unsigned_long>::default_value
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff340,
             (unsigned_long)in_stack_fffffffffffff338);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_270,"max number of unique label",&local_271);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff330,
             (string *)CONCAT44(in_stack_fffffffffffff32c,in_stack_fffffffffffff328));
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            ((option_group_definition *)in_stack_fffffffffffff380,
             (typed_option<unsigned_long> *)in_stack_fffffffffffff378);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_338,"leaf_example_multiplier",&local_339);
  std::unique_ptr<memory_tree_ns::memory_tree,_void_(*)(void_*)>::operator->
            ((unique_ptr<memory_tree_ns::memory_tree,_void_(*)(void_*)> *)0x2b69d9);
  VW::config::make_option<unsigned_long>
            (in_stack_fffffffffffff338,(unsigned_long *)in_stack_fffffffffffff330);
  VW::config::typed_option<unsigned_long>::default_value
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff340,
             (unsigned_long)in_stack_fffffffffffff338);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_360,"multiplier on examples per leaf (default = log nodes)",&local_361);
  VW::config::typed_option<unsigned_long>::help
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff330,
             (string *)CONCAT44(in_stack_fffffffffffff32c,in_stack_fffffffffffff328));
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            ((option_group_definition *)in_stack_fffffffffffff380,
             (typed_option<unsigned_long> *)in_stack_fffffffffffff378);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_428,"alpha",&local_429);
  std::unique_ptr<memory_tree_ns::memory_tree,_void_(*)(void_*)>::operator->
            ((unique_ptr<memory_tree_ns::memory_tree,_void_(*)(void_*)> *)0x2b6ac4);
  VW::config::make_option<float>(in_stack_fffffffffffff338,(float *)in_stack_fffffffffffff330);
  VW::config::typed_option<float>::default_value
            (in_stack_fffffffffffff340,(float)((ulong)in_stack_fffffffffffff338 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_450,"Alpha",&local_451);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_fffffffffffff330,
             (string *)CONCAT44(in_stack_fffffffffffff32c,in_stack_fffffffffffff328));
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            ((option_group_definition *)in_stack_fffffffffffff380,in_stack_fffffffffffff378);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_518,"dream_repeats",&local_519);
  std::unique_ptr<memory_tree_ns::memory_tree,_void_(*)(void_*)>::operator->
            ((unique_ptr<memory_tree_ns::memory_tree,_void_(*)(void_*)> *)0x2b6bb2);
  VW::config::make_option<unsigned_int>(in_stack_fffffffffffff338,(uint *)in_stack_fffffffffffff330)
  ;
  VW::config::typed_option<unsigned_int>::default_value
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff340,
             (uint)((ulong)in_stack_fffffffffffff338 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_540,"number of dream operations per example (default = 1)",&local_541);
  VW::config::typed_option<unsigned_int>::help
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff330,
             (string *)CONCAT44(in_stack_fffffffffffff32c,in_stack_fffffffffffff328));
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_int>&>
            ((option_group_definition *)in_stack_fffffffffffff380,
             (typed_option<unsigned_int> *)in_stack_fffffffffffff378);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_608,"top_K",&local_609);
  std::unique_ptr<memory_tree_ns::memory_tree,_void_(*)(void_*)>::operator->
            ((unique_ptr<memory_tree_ns::memory_tree,_void_(*)(void_*)> *)0x2b6ca0);
  VW::config::make_option<int>(in_stack_fffffffffffff338,(int *)in_stack_fffffffffffff330);
  VW::config::typed_option<int>::default_value
            ((typed_option<int> *)in_stack_fffffffffffff340,
             (int)((ulong)in_stack_fffffffffffff338 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_630,"top K prediction error (default 1)",&local_631);
  VW::config::typed_option<int>::help
            ((typed_option<int> *)in_stack_fffffffffffff330,
             (string *)CONCAT44(in_stack_fffffffffffff32c,in_stack_fffffffffffff328));
  l_00 = VW::config::option_group_definition::add<VW::config::typed_option<int>&>
                   ((option_group_definition *)in_stack_fffffffffffff380,
                    (typed_option<int> *)in_stack_fffffffffffff378);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6f8,"learn_at_leaf",&local_6f9);
  std::unique_ptr<memory_tree_ns::memory_tree,_void_(*)(void_*)>::operator->
            ((unique_ptr<memory_tree_ns::memory_tree,_void_(*)(void_*)> *)0x2b6d8e);
  VW::config::make_option<int>(in_stack_fffffffffffff338,(int *)in_stack_fffffffffffff330);
  VW::config::typed_option<int>::default_value
            ((typed_option<int> *)in_stack_fffffffffffff340,
             (int)((ulong)in_stack_fffffffffffff338 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_720,"whether or not learn at leaf (defualt = True)",&local_721)
  ;
  VW::config::typed_option<int>::help
            ((typed_option<int> *)in_stack_fffffffffffff330,
             (string *)CONCAT44(in_stack_fffffffffffff32c,in_stack_fffffffffffff328));
  VW::config::option_group_definition::add<VW::config::typed_option<int>&>
            ((option_group_definition *)in_stack_fffffffffffff380,
             (typed_option<int> *)in_stack_fffffffffffff378);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7e8,"oas",&local_7e9);
  std::unique_ptr<memory_tree_ns::memory_tree,_void_(*)(void_*)>::operator->
            ((unique_ptr<memory_tree_ns::memory_tree,_void_(*)(void_*)> *)0x2b6e79);
  VW::config::make_option<int>(in_stack_fffffffffffff338,(int *)in_stack_fffffffffffff330);
  VW::config::typed_option<int>::default_value
            ((typed_option<int> *)in_stack_fffffffffffff340,
             (int)((ulong)in_stack_fffffffffffff338 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_810,"use oas at the leaf",&local_811);
  VW::config::typed_option<int>::help
            ((typed_option<int> *)in_stack_fffffffffffff330,
             (string *)CONCAT44(in_stack_fffffffffffff32c,in_stack_fffffffffffff328));
  VW::config::option_group_definition::add<VW::config::typed_option<int>&>
            ((option_group_definition *)in_stack_fffffffffffff380,
             (typed_option<int> *)in_stack_fffffffffffff378);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8d8,"dream_at_update",&local_8d9);
  std::unique_ptr<memory_tree_ns::memory_tree,_void_(*)(void_*)>::operator->
            ((unique_ptr<memory_tree_ns::memory_tree,_void_(*)(void_*)> *)0x2b6f64);
  VW::config::make_option<int>(in_stack_fffffffffffff338,(int *)in_stack_fffffffffffff330);
  VW::config::typed_option<int>::default_value
            ((typed_option<int> *)in_stack_fffffffffffff340,
             (int)((ulong)in_stack_fffffffffffff338 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_900,"turn on dream operations at reward based update as well",&local_901);
  VW::config::typed_option<int>::help
            ((typed_option<int> *)in_stack_fffffffffffff330,
             (string *)CONCAT44(in_stack_fffffffffffff32c,in_stack_fffffffffffff328));
  VW::config::option_group_definition::add<VW::config::typed_option<int>&>
            ((option_group_definition *)in_stack_fffffffffffff380,
             (typed_option<int> *)in_stack_fffffffffffff378);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9c8,"online",&local_9c9);
  std::unique_ptr<memory_tree_ns::memory_tree,_void_(*)(void_*)>::operator->
            ((unique_ptr<memory_tree_ns::memory_tree,_void_(*)(void_*)> *)0x2b704f);
  VW::config::make_option<int>(in_stack_fffffffffffff338,(int *)in_stack_fffffffffffff330);
  VW::config::typed_option<int>::default_value
            ((typed_option<int> *)in_stack_fffffffffffff340,
             (int)((ulong)in_stack_fffffffffffff338 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_9f0,"turn on dream operations at reward based update as well",&local_9f1);
  VW::config::typed_option<int>::help
            ((typed_option<int> *)in_stack_fffffffffffff330,
             (string *)CONCAT44(in_stack_fffffffffffff32c,in_stack_fffffffffffff328));
  VW::config::option_group_definition::add<VW::config::typed_option<int>&>
            ((option_group_definition *)in_stack_fffffffffffff380,
             (typed_option<int> *)in_stack_fffffffffffff378);
  std::__cxx11::string::~string(local_9f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_9f1);
  VW::config::typed_option<int>::~typed_option((typed_option<int> *)in_stack_fffffffffffff330);
  std::__cxx11::string::~string(local_9c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_9c9);
  std::__cxx11::string::~string(local_900);
  std::allocator<char>::~allocator((allocator<char> *)&local_901);
  VW::config::typed_option<int>::~typed_option((typed_option<int> *)in_stack_fffffffffffff330);
  std::__cxx11::string::~string(local_8d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8d9);
  std::__cxx11::string::~string(local_810);
  std::allocator<char>::~allocator((allocator<char> *)&local_811);
  VW::config::typed_option<int>::~typed_option((typed_option<int> *)in_stack_fffffffffffff330);
  std::__cxx11::string::~string(local_7e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7e9);
  std::__cxx11::string::~string(local_720);
  std::allocator<char>::~allocator((allocator<char> *)&local_721);
  VW::config::typed_option<int>::~typed_option((typed_option<int> *)in_stack_fffffffffffff330);
  std::__cxx11::string::~string(local_6f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6f9);
  std::__cxx11::string::~string(local_630);
  std::allocator<char>::~allocator((allocator<char> *)&local_631);
  VW::config::typed_option<int>::~typed_option((typed_option<int> *)in_stack_fffffffffffff330);
  std::__cxx11::string::~string(local_608);
  std::allocator<char>::~allocator((allocator<char> *)&local_609);
  std::__cxx11::string::~string(local_540);
  std::allocator<char>::~allocator((allocator<char> *)&local_541);
  VW::config::typed_option<unsigned_int>::~typed_option
            ((typed_option<unsigned_int> *)in_stack_fffffffffffff330);
  std::__cxx11::string::~string(local_518);
  std::allocator<char>::~allocator((allocator<char> *)&local_519);
  std::__cxx11::string::~string(local_450);
  std::allocator<char>::~allocator((allocator<char> *)&local_451);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_fffffffffffff330);
  std::__cxx11::string::~string(local_428);
  std::allocator<char>::~allocator((allocator<char> *)&local_429);
  std::__cxx11::string::~string(local_360);
  std::allocator<char>::~allocator((allocator<char> *)&local_361);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff330);
  std::__cxx11::string::~string(local_338);
  std::allocator<char>::~allocator((allocator<char> *)&local_339);
  std::__cxx11::string::~string(local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff330);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  VW::config::typed_option<unsigned_long>::~typed_option
            ((typed_option<unsigned_long> *)in_stack_fffffffffffff330);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  (**(code **)*local_10)(local_10,local_60);
  pmVar11 = std::unique_ptr<memory_tree_ns::memory_tree,_void_(*)(void_*)>::operator->
                      ((unique_ptr<memory_tree_ns::memory_tree,_void_(*)(void_*)> *)0x2b73a3);
  pvVar10 = local_18;
  if (pmVar11->max_nodes == 0) {
    local_8 = (base_learner *)0x0;
  }
  else {
    pmVar11 = std::unique_ptr<memory_tree_ns::memory_tree,_void_(*)(void_*)>::operator->
                        ((unique_ptr<memory_tree_ns::memory_tree,_void_(*)(void_*)> *)0x2b7bb4);
    pmVar11->all = pvVar10;
    pmVar11 = std::unique_ptr<memory_tree_ns::memory_tree,_void_(*)(void_*)>::operator->
                        ((unique_ptr<memory_tree_ns::memory_tree,_void_(*)(void_*)> *)0x2b7bcc);
    pmVar11->current_pass = 0;
    sVar1 = local_18->numpasses;
    pmVar11 = std::unique_ptr<memory_tree_ns::memory_tree,_void_(*)(void_*)>::operator->
                        ((unique_ptr<memory_tree_ns::memory_tree,_void_(*)(void_*)> *)0x2b7bfb);
    pmVar11->final_pass = sVar1;
    pmVar11 = std::unique_ptr<memory_tree_ns::memory_tree,_void_(*)(void_*)>::operator->
                        ((unique_ptr<memory_tree_ns::memory_tree,_void_(*)(void_*)> *)0x2b7c17);
    sVar1 = pmVar11->leaf_example_multiplier;
    auVar18._8_4_ = (int)(sVar1 >> 0x20);
    auVar18._0_8_ = sVar1;
    auVar18._12_4_ = 0x45300000;
    std::unique_ptr<memory_tree_ns::memory_tree,_void_(*)(void_*)>::operator->
              ((unique_ptr<memory_tree_ns::memory_tree,_void_(*)(void_*)> *)0x2b7c54);
    _Var15 = std::log<unsigned_long>(0x2b7c5d);
    _Var16 = std::log<int>(0);
    dVar17 = ((auVar18._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) * (_Var15 / _Var16);
    uVar12 = (ulong)dVar17;
    pmVar11 = std::unique_ptr<memory_tree_ns::memory_tree,_void_(*)(void_*)>::operator->
                        ((unique_ptr<memory_tree_ns::memory_tree,_void_(*)(void_*)> *)0x2b7ce3);
    pmVar11->max_leaf_examples =
         uVar12 | (long)(dVar17 - 9.223372036854776e+18) & (long)uVar12 >> 0x3f;
    std::unique_ptr<memory_tree_ns::memory_tree,_void_(*)(void_*)>::operator*
              ((unique_ptr<memory_tree_ns::memory_tree,_void_(*)(void_*)> *)
               in_stack_fffffffffffff330);
    memory_tree_ns::init_tree(in_stack_fffffffffffff380);
    if ((local_18->quiet & 1U) == 0) {
      poVar13 = std::operator<<(&(local_18->trace_message).super_ostream,"memory_tree:");
      poVar13 = std::operator<<(poVar13," ");
      poVar13 = std::operator<<(poVar13,"max_nodes = ");
      pmVar11 = std::unique_ptr<memory_tree_ns::memory_tree,_void_(*)(void_*)>::operator->
                          ((unique_ptr<memory_tree_ns::memory_tree,_void_(*)(void_*)> *)0x2b7d98);
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,pmVar11->max_nodes);
      poVar13 = std::operator<<(poVar13," ");
      poVar13 = std::operator<<(poVar13,"max_leaf_examples = ");
      pmVar11 = std::unique_ptr<memory_tree_ns::memory_tree,_void_(*)(void_*)>::operator->
                          ((unique_ptr<memory_tree_ns::memory_tree,_void_(*)(void_*)> *)0x2b7dfc);
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,pmVar11->max_leaf_examples);
      poVar13 = std::operator<<(poVar13," ");
      poVar13 = std::operator<<(poVar13,"alpha = ");
      pmVar11 = std::unique_ptr<memory_tree_ns::memory_tree,_void_(*)(void_*)>::operator->
                          ((unique_ptr<memory_tree_ns::memory_tree,_void_(*)(void_*)> *)0x2b7e60);
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,pmVar11->alpha);
      poVar13 = std::operator<<(poVar13," ");
      poVar13 = std::operator<<(poVar13,"oas = ");
      pmVar11 = std::unique_ptr<memory_tree_ns::memory_tree,_void_(*)(void_*)>::operator->
                          ((unique_ptr<memory_tree_ns::memory_tree,_void_(*)(void_*)> *)0x2b7ec5);
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,pmVar11->oas);
      poVar13 = std::operator<<(poVar13," ");
      poVar13 = std::operator<<(poVar13,"online =");
      pmVar11 = std::unique_ptr<memory_tree_ns::memory_tree,_void_(*)(void_*)>::operator->
                          ((unique_ptr<memory_tree_ns::memory_tree,_void_(*)(void_*)> *)0x2b7f22);
      poVar13 = (ostream *)std::ostream::operator<<(poVar13,pmVar11->online);
      poVar13 = std::operator<<(poVar13," ");
      std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
    }
    pmVar11 = std::unique_ptr<memory_tree_ns::memory_tree,_void_(*)(void_*)>::operator->
                        ((unique_ptr<memory_tree_ns::memory_tree,_void_(*)(void_*)> *)0x2b7f7f);
    if (pmVar11->oas == 0) {
      std::unique_ptr<memory_tree_ns::memory_tree,_void_(*)(void_*)>::operator->
                ((unique_ptr<memory_tree_ns::memory_tree,_void_(*)(void_*)> *)0x2b7f99);
      setup_base((options_i *)in_stack_fffffffffffff338,in_stack_fffffffffffff330);
      LEARNER::as_singleline<char,char>((learner<char,_char> *)l_00);
      plVar14 = LEARNER::
                init_multiclass_learner<memory_tree_ns::memory_tree,example,LEARNER::learner<char,example>>
                          ((free_ptr<memory_tree_ns::memory_tree> *)in_stack_fffffffffffff350,
                           in_stack_fffffffffffff348,
                           (_func_void_memory_tree_ptr_learner<char,_example>_ptr_example_ptr *)
                           in_stack_fffffffffffff340,
                           (_func_void_memory_tree_ptr_learner<char,_example>_ptr_example_ptr *)
                           in_stack_fffffffffffff338,(parser *)in_stack_fffffffffffff330,
                           CONCAT44(in_stack_fffffffffffff32c,4),in_stack_fffffffffffff360);
      LEARNER::learner<memory_tree_ns::memory_tree,_example>::set_save_load
                (plVar14,memory_tree_ns::save_load_memory_tree);
      LEARNER::learner<memory_tree_ns::memory_tree,_example>::set_end_pass
                (in_stack_fffffffffffff350,(_func_void_memory_tree_ptr *)in_stack_fffffffffffff348);
      LEARNER::learner<memory_tree_ns::memory_tree,_example>::set_finish
                (in_stack_fffffffffffff350,(_func_void_memory_tree_ptr *)in_stack_fffffffffffff348);
      local_8 = LEARNER::make_base<memory_tree_ns::memory_tree,example>(plVar14);
    }
    else {
      plVar14 = local_28;
      std::unique_ptr<memory_tree_ns::memory_tree,_void_(*)(void_*)>::operator->
                ((unique_ptr<memory_tree_ns::memory_tree,_void_(*)(void_*)> *)0x2b80ab);
      std::unique_ptr<memory_tree_ns::memory_tree,_void_(*)(void_*)>::operator->
                ((unique_ptr<memory_tree_ns::memory_tree,_void_(*)(void_*)> *)0x2b80be);
      setup_base((options_i *)in_stack_fffffffffffff338,in_stack_fffffffffffff330);
      base = LEARNER::as_singleline<char,char>((learner<char,_char> *)l_00);
      this = (typed_option<float> *)
             LEARNER::
             init_learner<memory_tree_ns::memory_tree,example,LEARNER::learner<char,example>>
                       ((free_ptr<memory_tree_ns::memory_tree> *)plVar14,base,
                        (_func_void_memory_tree_ptr_learner<char,_example>_ptr_example_ptr *)
                        in_stack_fffffffffffff340,
                        (_func_void_memory_tree_ptr_learner<char,_example>_ptr_example_ptr *)
                        in_stack_fffffffffffff338,(size_t)in_stack_fffffffffffff330,
                        in_stack_fffffffffffff32c);
      in_stack_fffffffffffff340 = this;
      LEARNER::learner<memory_tree_ns::memory_tree,_example>::set_end_pass
                (plVar14,(_func_void_memory_tree_ptr *)base);
      LEARNER::learner<memory_tree_ns::memory_tree,_example>::set_save_load
                ((learner<memory_tree_ns::memory_tree,_example> *)this,
                 memory_tree_ns::save_load_memory_tree);
      LEARNER::learner<memory_tree_ns::memory_tree,_example>::set_finish
                (plVar14,(_func_void_memory_tree_ptr *)base);
      ppVar2 = local_18->p;
      (ppVar2->lp).label_size = MULTILABEL::multilabel._64_8_;
      uVar9 = MULTILABEL::multilabel._56_8_;
      uVar8 = MULTILABEL::multilabel._40_8_;
      uVar7 = MULTILABEL::multilabel._32_8_;
      uVar6 = MULTILABEL::multilabel._24_8_;
      uVar5 = MULTILABEL::multilabel._16_8_;
      uVar4 = MULTILABEL::multilabel._8_8_;
      uVar3 = MULTILABEL::multilabel._0_8_;
      (ppVar2->lp).copy_label = (_func_void_void_ptr_void_ptr *)MULTILABEL::multilabel._48_8_;
      (ppVar2->lp).test_label = (_func_bool_void_ptr *)uVar9;
      (ppVar2->lp).delete_label = (_func_void_void_ptr *)uVar7;
      (ppVar2->lp).get_weight = (_func_float_void_ptr *)uVar8;
      (ppVar2->lp).cache_label = (_func_void_void_ptr_io_buf_ptr *)uVar5;
      (ppVar2->lp).read_cached_label = (_func_size_t_shared_data_ptr_void_ptr_io_buf_ptr *)uVar6;
      (ppVar2->lp).default_label = (_func_void_void_ptr *)uVar3;
      (ppVar2->lp).parse_label =
           (_func_void_parser_ptr_shared_data_ptr_void_ptr_v_array<substring>_ptr *)uVar4;
      local_18->label_type = multi;
      local_18->delete_prediction = (_func_void_void_ptr *)MULTILABEL::multilabel._32_8_;
      local_8 = LEARNER::make_base<memory_tree_ns::memory_tree,example>
                          ((learner<memory_tree_ns::memory_tree,_example> *)this);
    }
  }
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff330);
  std::unique_ptr<memory_tree_ns::memory_tree,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<memory_tree_ns::memory_tree,_void_(*)(void_*)> *)in_stack_fffffffffffff340)
  ;
  return local_8;
}

Assistant:

base_learner* memory_tree_setup(options_i& options, vw& all)
{
    using namespace memory_tree_ns;
	auto tree = scoped_calloc_or_throw<memory_tree>();
    option_group_definition new_options("Memory Tree");

    new_options.add(make_option("memory_tree", tree->max_nodes).keep().default_value(0).help("Make a memory tree with at most <n> nodes"))
        .add(make_option("max_number_of_labels",tree->max_num_labels).default_value(10).help("max number of unique label"))
        .add(make_option("leaf_example_multiplier",tree->leaf_example_multiplier).default_value(1).help("multiplier on examples per leaf (default = log nodes)"))
        .add(make_option("alpha", tree->alpha).default_value(0.1f).help("Alpha"))
        .add(make_option("dream_repeats", tree->dream_repeats).default_value(1).help("number of dream operations per example (default = 1)"))
        .add(make_option("top_K",tree->top_K).default_value(1).help("top K prediction error (default 1)"))
        .add(make_option("learn_at_leaf",tree->learn_at_leaf).default_value(0).help("whether or not learn at leaf (defualt = True)"))
        .add(make_option("oas", tree->oas).default_value(0).help("use oas at the leaf"))
        .add(make_option("dream_at_update", tree->dream_at_update).default_value(0).help("turn on dream operations at reward based update as well"))
        .add(make_option("online", tree->online).default_value(0).help("turn on dream operations at reward based update as well"));
    options.add_and_parse(new_options);
if (!tree->max_nodes)
{
  return nullptr;
}

    tree->all = &all;
    tree->current_pass = 0;
    tree->final_pass = all.numpasses;

    tree->max_leaf_examples = tree->leaf_example_multiplier*(log(tree->max_nodes)/log(2));

    
    init_tree(*tree);

    if (!all.quiet)
        all.trace_message << "memory_tree:" << " "
            <<"max_nodes = "<< tree->max_nodes << " " 
            <<"max_leaf_examples = "<<tree->max_leaf_examples<<" "
 		    <<"alpha = "<<tree->alpha<<" "
            <<"oas = "<<tree->oas<<" "
            <<"online ="<<tree->online<<" "
            <<std::endl;
    
    size_t num_learners = 0;
    
    //multi-class classification
    if (tree->oas == false){
        num_learners = tree->max_nodes + 1;
        learner<memory_tree, example>& l = init_multiclass_learner (tree, 
                as_singleline(setup_base (options,all)),
                learn,
                predict,
                all.p, num_learners);
         //srand(time(0));
        l.set_save_load(save_load_memory_tree);
        l.set_end_pass(end_pass);
        l.set_finish(finish);

        return make_base (l);
    } //multi-label classification
    else{
        num_learners = tree->max_nodes + 1 + tree->max_num_labels;
        learner<memory_tree,example>& l = 
        init_learner(tree, 
                as_singleline(setup_base(options,all)), 
                learn, 
                predict, 
                num_learners,
                prediction_type::multilabels);

	//all.p->lp = MULTILABEL::multilabel;
        //all.label_type = label_type::multi;
        //all.delete_prediction = MULTILABEL::multilabel.delete_label;
         //srand(time(0));
	l.set_end_pass(end_pass);
        l.set_save_load(save_load_memory_tree);
        //l.set_end_pass(end_pass);
        l.set_finish(finish);

	all.p->lp = MULTILABEL::multilabel;
	all.label_type = label_type::multi;
	all.delete_prediction = MULTILABEL::multilabel.delete_label;

        return make_base (l);
    }

}